

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

Node * __thiscall
Patch::build_node(Patch *this,Node *left,Node *right,Point old_distance_from_left_ancestor,
                 Point new_distance_from_left_ancestor,Point old_extent,Point new_extent,
                 optional<Text> *old_text,optional<Text> *new_text,uint32_t old_text_size)

{
  Node *right_00;
  Node *left_00;
  bool bVar1;
  Node *this_00;
  Text *pTVar2;
  Text *pTVar3;
  unique_ptr<Text,_std::default_delete<Text>_> local_88;
  undefined1 local_79;
  Text *local_78;
  unique_ptr<Text,_std::default_delete<Text>_> local_60;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Node *local_38;
  Node *right_local;
  Node *left_local;
  Patch *this_local;
  Point old_extent_local;
  Point new_distance_from_left_ancestor_local;
  Point old_distance_from_left_ancestor_local;
  
  this->change_count = this->change_count + 1;
  local_38 = right;
  right_local = left;
  left_local = (Node *)this;
  this_local = (Patch *)old_extent;
  old_extent_local = new_distance_from_left_ancestor;
  this_00 = (Node *)operator_new(0x50);
  left_00 = right_local;
  right_00 = local_38;
  local_40 = (Point)this_local;
  local_48 = new_extent;
  local_58 = old_extent_local;
  local_79 = 0;
  local_50 = old_distance_from_left_ancestor;
  bVar1 = ::optional::operator_cast_to_bool((optional *)old_text);
  if (bVar1) {
    pTVar2 = (Text *)operator_new(0x38);
    local_79 = 1;
    local_78 = pTVar2;
    pTVar3 = optional<Text>::operator*(old_text);
    Text::Text(pTVar2,pTVar3);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_60,pTVar2);
  }
  else {
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_60,(nullptr_t)0x0);
  }
  bVar1 = ::optional::operator_cast_to_bool((optional *)new_text);
  if (bVar1) {
    pTVar2 = (Text *)operator_new(0x38);
    pTVar3 = optional<Text>::operator*(new_text);
    Text::Text(pTVar2,pTVar3);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_88,pTVar2);
  }
  else {
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_88,(nullptr_t)0x0);
  }
  Node::Node(this_00,left_00,right_00,local_40,local_48,local_50,local_58,&local_60,&local_88,
             old_text_size);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(&local_88);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(&local_60);
  return this_00;
}

Assistant:

Patch::Node *Patch::build_node(Node *left, Node *right,
                       Point old_distance_from_left_ancestor,
                       Point new_distance_from_left_ancestor,
                       Point old_extent, Point new_extent,
                       optional<Text> &&old_text, optional<Text> &&new_text,
                       uint32_t old_text_size) {
  change_count++;
  return new Node{
    left,
    right,
    old_extent,
    new_extent,
    old_distance_from_left_ancestor,
    new_distance_from_left_ancestor,
    old_text ? unique_ptr<Text>{new Text(*old_text)} : nullptr,
    new_text ? unique_ptr<Text>{new Text(*new_text)} : nullptr,
    old_text_size
  };
}